

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

Vec_Wec_t * Spl_ManToWecMapping(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wec_t *p_00;
  int *piVar2;
  int local_24;
  int k;
  int Fanin;
  int Obj;
  Vec_Wec_t *vMapping;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_WecStart(iVar1);
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 != 0) {
    for (k = 1; iVar1 = Gia_ManObjNum(p), k < iVar1; k = k + 1) {
      iVar1 = Gia_ObjIsLut(p,k);
      if (iVar1 != 0) {
        for (local_24 = 0; iVar1 = Gia_ObjLutSize(p,k), local_24 < iVar1; local_24 = local_24 + 1) {
          piVar2 = Gia_ObjLutFanins(p,k);
          Vec_WecPush(p_00,k,piVar2[local_24]);
        }
      }
    }
    return p_00;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                ,0x49,"Vec_Wec_t *Spl_ManToWecMapping(Gia_Man_t *)");
}

Assistant:

Vec_Wec_t * Spl_ManToWecMapping( Gia_Man_t * p )
{
    Vec_Wec_t * vMapping = Vec_WecStart( Gia_ManObjNum(p) );
    int Obj, Fanin, k;
    assert( Gia_ManHasMapping(p) );
    Gia_ManForEachLut( p, Obj )
        Gia_LutForEachFanin( p, Obj, Fanin, k )
            Vec_WecPush( vMapping, Obj, Fanin );
    return vMapping;
}